

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_iface.hpp
# Opt level: O0

void __thiscall
Args::GroupIface::GroupIface<char_const(&)[2]>(GroupIface *this,char (*name) [2],bool required)

{
  byte in_DL;
  char *in_RSI;
  ArgIface *in_RDI;
  allocator local_12;
  byte local_11;
  char *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  ArgIface::ArgIface(in_RDI);
  in_RDI->_vptr_ArgIface = (_func_int **)&PTR__GroupIface_00184c78;
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::vector((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)0x14c242);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&in_RDI[2].m_cmdLine,local_10,&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  *(byte *)&in_RDI[4].m_cmdLine = local_11 & 1;
  return;
}

Assistant:

explicit GroupIface( T && name,
		bool required = false )
		:	m_name( std::forward< T > ( name ) )
		,	m_required( required )
	{
	}